

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O2

void __thiscall QSharedMemoryPrivate::~QSharedMemoryPrivate(QSharedMemoryPrivate *this)

{
  (this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QSharedMemoryPrivate_006608f0;
  destructBackend(this);
  QSystemSemaphore::~QSystemSemaphore(&this->systemSemaphore);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->errorString).d);
  QNativeIpcKey::~QNativeIpcKey(&this->nativeKey);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QSharedMemoryPrivate::~QSharedMemoryPrivate()
{
    destructBackend();
}